

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *block,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *old_ids_to_new_ids)

{
  bool bVar1;
  Instruction *pIVar2;
  DefUseManager *this_00;
  iterator local_58;
  function<void_(unsigned_int_*)> local_50;
  undefined1 local_30 [16];
  iterator block_itr;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *old_ids_to_new_ids_local;
  BasicBlock *block_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  block_itr.super_iterator.node_ = (iterator)(iterator)old_ids_to_new_ids;
  BasicBlock::begin((BasicBlock *)(local_30 + 8));
  while( true ) {
    BasicBlock::end((BasicBlock *)local_30);
    bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)(local_30 + 8),
                              (iterator_template<spvtools::opt::Instruction> *)local_30);
    if (!bVar1) break;
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)(local_30 + 8));
    local_58 = block_itr.super_iterator.node_;
    std::function<void(unsigned_int*)>::
    function<spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock(spvtools::opt::BasicBlock*,std::unordered_map<unsigned_int,unsigned_int,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>const&)const::__0,void>
              ((function<void(unsigned_int*)> *)&local_50,(anon_class_8_1_72478d92 *)&local_58);
    opt::Instruction::ForEachInId(pIVar2,&local_50);
    std::function<void_(unsigned_int_*)>::~function(&local_50);
    this_00 = Pass::get_def_use_mgr(&this->super_Pass);
    pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator*
                       ((iterator_template<spvtools::opt::Instruction> *)(local_30 + 8));
    analysis::DefUseManager::AnalyzeInstUse(this_00,pIVar2);
    InstructionList::iterator::operator++((iterator *)(local_30 + 8));
  }
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::UseNewIdsInBlock(
    BasicBlock* block,
    const std::unordered_map<uint32_t, uint32_t>& old_ids_to_new_ids) const {
  for (auto block_itr = block->begin(); block_itr != block->end();
       ++block_itr) {
    (&*block_itr)->ForEachInId([&old_ids_to_new_ids](uint32_t* idp) {
      auto old_ids_to_new_ids_itr = old_ids_to_new_ids.find(*idp);
      if (old_ids_to_new_ids_itr == old_ids_to_new_ids.end()) return;
      *idp = old_ids_to_new_ids_itr->second;
    });
    get_def_use_mgr()->AnalyzeInstUse(&*block_itr);
  }
}